

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l10n.c
# Opt level: O0

l10n_text * l10n_text_create(void)

{
  l10n_text *txt_00;
  l10n_text *txt;
  
  txt_00 = (l10n_text *)calloc(1,0x18);
  if (txt_00 != (l10n_text *)0x0) {
    l10n_text_init(txt_00);
    txt_00->refcount = 1;
  }
  return txt_00;
}

Assistant:

l10n_text *l10n_text_create(void)
{
    l10n_text *txt = calloc(1, sizeof(l10n_text));
    if (txt) {
        l10n_text_init(txt);
        txt->refcount = 1;
    }
    return txt;
}